

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execAndiEa<(moira::Instr)60,(moira::Mode)3,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  uint uVar3;
  ushort in_SI;
  Moira *in_RDI;
  int dst;
  u32 src;
  u32 result;
  u32 data;
  u32 ea;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  u32 in_stack_ffffffffffffffe8;
  u32 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff4;
  Moira *this_00;
  
  this_00 = in_RDI;
  uVar2 = readI<(moira::Size)4>
                    ((Moira *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  uVar3 = in_SI & 7;
  bVar1 = readOp<(moira::Mode)3,(moira::Size)4,0ul>
                    (this_00,CONCAT22(in_SI,in_stack_fffffffffffffff4),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (u32 *)(CONCAT44(uVar2,(uint)in_SI) & 0xffffffff00000007));
  if (bVar1) {
    logic<(moira::Instr)60,(moira::Size)4>
              ((Moira *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0)
                                ),in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
    prefetch<0ul>((Moira *)CONCAT44(uVar2,uVar3));
    writeOp<(moira::Mode)3,(moira::Size)4,5ul>
              ((Moira *)CONCAT44(uVar2,uVar3),(int)((ulong)in_RDI >> 0x20),(u32)in_RDI,0);
  }
  return;
}

Assistant:

void
Moira::execAndiEa(u16 opcode)
{
    u32 ea, data, result;

    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = logic<I,S>(src, data);
    prefetch();

    writeOp <M,S, POLLIPL | REVERSE> (dst, ea, result);
}